

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  bool bVar1;
  char *pcVar2;
  allocator<char> *__a;
  TestInfo *in_RDX;
  string *in_RDI;
  string kTestsuite;
  TestResult *result;
  TestInfo *in_stack_fffffffffffffb38;
  TestResult *in_stack_fffffffffffffb40;
  int *in_stack_fffffffffffffb68;
  allocator<char> *in_stack_fffffffffffffb70;
  char *in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *in_stack_fffffffffffffc18;
  string *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  ostream *in_stack_fffffffffffffc30;
  allocator<char> local_361;
  string local_360 [39];
  allocator<char> local_339;
  string local_338 [16];
  TimeInMillis in_stack_fffffffffffffcd8;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [32];
  string local_2d0 [39];
  undefined1 local_2a9 [40];
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [32];
  TestResult *in_stack_fffffffffffffdc8;
  ostream *in_stack_fffffffffffffdd0;
  TimeInMillis in_stack_fffffffffffffde8;
  allocator<char> local_209;
  string local_208 [36];
  int local_1e4;
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [39];
  undefined1 local_141 [40];
  ostream local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [32];
  undefined4 local_58;
  allocator<char> local_41;
  string local_40 [32];
  TestResult *local_20;
  TestInfo *local_18;
  string *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = TestInfo::result(in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = TestInfo::is_in_another_shard(local_18);
  if (bVar1) {
    local_58 = 1;
  }
  else {
    std::operator<<((ostream *)local_8,"    <testcase");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    TestInfo::name((TestInfo *)0x175a2c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    OutputXmlAttribute(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20
                       ,in_stack_fffffffffffffc18);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    pcVar2 = TestInfo::value_param(in_stack_fffffffffffffb38);
    if (pcVar2 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      TestInfo::value_param(in_stack_fffffffffffffb38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      OutputXmlAttribute(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator(&local_f1);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator(&local_c9);
    }
    pcVar2 = TestInfo::type_param(in_stack_fffffffffffffb38);
    if (pcVar2 != (char *)0x0) {
      in_stack_fffffffffffffc30 = &local_119;
      in_stack_fffffffffffffc28 = local_8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      in_stack_fffffffffffffc20 = (string *)TestInfo::type_param(in_stack_fffffffffffffb38);
      in_stack_fffffffffffffc18 = (string *)local_141;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      OutputXmlAttribute(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string((string *)(local_141 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_141);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
    }
    if ((FLAGS_gtest_list_tests & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      TestInfo::should_run(local_18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      OutputXmlAttribute(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdcf);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator(&local_209);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      bVar1 = TestInfo::should_run(local_18);
      if (bVar1) {
        TestResult::Skipped(in_stack_fffffffffffffb40);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      OutputXmlAttribute(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator(&local_281);
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator(&local_259);
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)local_8,in_stack_fffffffffffffb70);
      __a = (allocator<char> *)TestResult::elapsed_time(local_20);
      FormatTimeInMillisAsSeconds_abi_cxx11_(in_stack_fffffffffffffcd8);
      OutputXmlAttribute(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string(local_2d0);
      std::__cxx11::string::~string((string *)(local_2a9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_2a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this,(char *)local_8,__a);
      TestResult::start_timestamp(local_20);
      FormatEpochTimeInMillisAsIso8601_abi_cxx11_(in_stack_fffffffffffffde8);
      OutputXmlAttribute(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string(local_318);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator(&local_2f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this,(char *)local_8,__a);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this,(char *)local_8,__a);
      OutputXmlAttribute(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string(local_360);
      std::allocator<char>::~allocator(&local_361);
      std::__cxx11::string::~string(local_338);
      std::allocator<char>::~allocator(&local_339);
      OutputXmlTestResult(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      local_58 = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      TestInfo::file((TestInfo *)0x175efd);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      OutputXmlAttribute(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator(&local_191);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator(&local_169);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      local_1e4 = TestInfo::line(local_18);
      StreamableToString<int>(in_stack_fffffffffffffb68);
      OutputXmlAttribute(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      std::operator<<((ostream *)local_8," />\n");
      local_58 = 1;
    }
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_suite_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";

  if (test_info.is_in_another_shard()) {
    return;
  }

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestsuite, "name", test_info.name());

  if (test_info.value_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "type_param",
                       test_info.type_param());
  }
  if (GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "file", test_info.file());
    OutputXmlAttribute(stream, kTestsuite, "line",
                       StreamableToString(test_info.line()));
    *stream << " />\n";
    return;
  }

  OutputXmlAttribute(stream, kTestsuite, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestsuite, "result",
                     test_info.should_run()
                         ? (result.Skipped() ? "skipped" : "completed")
                         : "suppressed");
  OutputXmlAttribute(stream, kTestsuite, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, kTestsuite, "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));
  OutputXmlAttribute(stream, kTestsuite, "classname", test_suite_name);

  OutputXmlTestResult(stream, result);
}